

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O3

QString * __thiscall
QMimeDatabasePrivate::genericIcon
          (QString *__return_storage_ptr__,QMimeDatabasePrivate *this,QString *name)

{
  QMutex *this_00;
  __pointer_type copy;
  pointer puVar1;
  QMimeProviderBase *pQVar2;
  Data *pDVar3;
  Providers *pPVar4;
  unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *provider;
  pointer puVar5;
  bool bVar6;
  
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar6 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar6) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar6) goto LAB_004a134b;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_004a134b:
  pPVar4 = providers(this);
  puVar1 = (pPVar4->
           super__Vector_base<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (pPVar4->
                super__Vector_base<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
    pQVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>._M_t.
             super__Tuple_impl<0UL,_QMimeProviderBase_*,_std::default_delete<QMimeProviderBase>_>.
             super__Head_base<0UL,_QMimeProviderBase_*,_false>._M_head_impl;
    (*pQVar2->_vptr_QMimeProviderBase[0xf])(__return_storage_ptr__,pQVar2,name);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_004a13c6;
    pDVar3 = (__return_storage_ptr__->d).d;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_004a13c6:
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QMimeDatabasePrivate::genericIcon(const QString &name)
{
    QMutexLocker locker(&mutex);
    for (const auto &provider : providers()) {
        QString genericIconName = provider->genericIcon(name);
        if (!genericIconName.isEmpty())
            return genericIconName;
    }
    return {};
}